

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int yyparse(void)

{
  size_t __n;
  byte *pbVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  byte *__dest;
  YYSTYPE root;
  int iVar4;
  long lVar5;
  long lVar6;
  YYSTYPE *pYVar7;
  short sVar8;
  uint uVar9;
  YYSTYPE *pos;
  char *pcVar10;
  int nodetype;
  ast *paVar11;
  ast *paVar12;
  byte *pbVar13;
  byte *pbVar14;
  YYSTYPE *pYVar15;
  long lVar16;
  YYSTYPE *__dest_00;
  int iVar17;
  bool bVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  int local_13e4;
  YYSTYPE *local_13d8;
  YYSTYPE *local_13d0;
  yy_state_t yyssa [200];
  YYSTYPE yyvsa [200];
  YYLTYPE yylsa [200];
  
  yychar = -2;
  yylsa[0]._8_8_ = yylloc._8_8_;
  yylsa[0]._0_8_ = yylloc._0_8_;
  pos = (YYSTYPE *)yylsa;
  lVar16 = 200;
  pbVar14 = yyssa;
  pYVar15 = yyvsa;
  local_13e4 = 0;
  iVar17 = 0;
  pbVar13 = pbVar14;
  local_13d8 = pYVar15;
  local_13d0 = pos;
  do {
    *pbVar14 = (byte)iVar17;
    __dest = pbVar13;
    if (pbVar13 + lVar16 + -1 <= pbVar14) {
      if (lVar16 < 10000) {
        lVar16 = lVar16 * 2;
        if (9999 < lVar16) {
          lVar16 = 10000;
        }
        __dest = (byte *)malloc(lVar16 * 0x19 + 0x1e);
        if (__dest != (byte *)0x0) {
          lVar5 = (long)pbVar14 - (long)pbVar13;
          __n = lVar5 + 1;
          memcpy(__dest,pbVar13,__n);
          __dest_00 = (YYSTYPE *)(__dest + ((lVar16 + 0xf) / 0x10) * 0x10);
          memcpy(__dest_00,local_13d8,__n * 8);
          pYVar7 = __dest_00 + ((lVar16 * 8 + 0xf) / 0x10) * 2;
          memcpy(pYVar7,local_13d0,__n * 0x10);
          if (pbVar13 != yyssa) {
            free(pbVar13);
          }
          if ((long)__n < lVar16) {
            pbVar14 = __dest + lVar5;
            pYVar15 = __dest_00 + lVar5;
            pos = pYVar7 + __n * 2 + -2;
            local_13d8 = __dest_00;
            local_13d0 = pYVar7;
            goto LAB_0010264e;
          }
          iVar17 = 1;
          goto LAB_00102fad;
        }
      }
      yyerror("memory exhausted");
      iVar17 = 2;
      goto LAB_00102fa0;
    }
LAB_0010264e:
    pbVar13 = __dest;
    if (iVar17 == 0xb) {
      iVar17 = 0;
      goto LAB_00102fa0;
    }
    uVar9 = (uint)yypact[iVar17];
    if (uVar9 != 0xffffff80) {
      if (yychar == -2) {
        yychar = yylex();
      }
      if (0 < yychar) {
        if (yychar != 0x100) {
          iVar4 = 2;
          if ((uint)yychar < 0x11e) {
            iVar4 = (int)""[(uint)yychar];
          }
          goto LAB_001026ec;
        }
        yychar = 0x101;
        goto LAB_00102870;
      }
      yychar = 0;
      iVar4 = 0;
LAB_001026ec:
      uVar3 = iVar4 + uVar9;
      if ((0x187 < uVar3) || (iVar4 != yycheck[uVar3])) goto LAB_00102752;
      iVar17 = (int)yytable[uVar3];
      if (yytable[uVar3] < 1) {
        iVar4 = -iVar17;
        goto LAB_00102763;
      }
      bVar18 = local_13e4 == 0;
      local_13e4 = local_13e4 + -1;
      if (bVar18) {
        local_13e4 = 0;
      }
      pYVar15[1] = yylval;
      pYVar15 = pYVar15 + 1;
      auVar2._8_4_ = yylloc.last_line;
      auVar2._12_4_ = yylloc.last_column;
      auVar2._0_4_ = yylloc.first_line;
      auVar2._4_4_ = yylloc.first_column;
      *(undefined1 (*) [16])(pos + 2) = auVar2;
      pos = pos + 2;
      yychar = -2;
      goto LAB_00102f79;
    }
LAB_00102752:
    iVar4 = (int)"\x04\x0f\x14"[iVar17];
    if ("\x04\x0f\x14"[iVar17] == '\0') {
      if (local_13e4 == 0) {
        yynerrs = yynerrs + 1;
        yyerror("syntax error");
      }
      else if (local_13e4 == 3) {
        if (yychar < 1) {
          if (yychar == 0) {
LAB_00102f9d:
            iVar17 = 1;
LAB_00102fa0:
            __dest = pbVar13;
            if (pbVar13 != yyssa) {
LAB_00102fad:
              free(__dest);
            }
            return iVar17;
          }
        }
        else {
          yychar = -2;
        }
      }
LAB_00102870:
      lVar5 = -0x10;
      lVar6 = 0;
      uVar19 = yylloc._0_8_;
      while (((sVar8 = (short)uVar9, sVar8 < -1 || (yycheck[(long)sVar8 + 1] != 1)) ||
             (iVar17 = (int)yytable[(long)sVar8 + 1], yytable[(long)sVar8 + 1] < 1))) {
        if (pbVar14 == __dest) goto LAB_00102f9d;
        uVar19 = *(undefined8 *)((long)pos + lVar6 * 2);
        pbVar1 = pbVar14 + -1;
        pbVar14 = pbVar14 + -1;
        uVar9 = (uint)(ushort)yypact[*pbVar1];
        lVar6 = lVar6 + -8;
        lVar5 = lVar5 + 0x10;
      }
      pYVar15 = (YYSTYPE *)((long)pYVar15 + lVar6 + 8);
      *pYVar15 = yylval;
      *(undefined8 *)((long)pos + lVar6 * 2 + 0x10) = uVar19;
      *(undefined8 *)((long)pos + lVar6 * 2 + 0x18) = yylloc._8_8_;
      pos = (YYSTYPE *)((long)pos - lVar5);
      local_13e4 = 3;
      goto LAB_00102f79;
    }
LAB_00102763:
    lVar5 = (long)""[iVar4];
    if (lVar5 == 0) {
      paVar11 = pos[1].type_ast;
      auVar20._8_4_ = (int)paVar11;
      auVar20._0_8_ = paVar11;
      auVar20._12_4_ = (int)((ulong)paVar11 >> 0x20);
    }
    else {
      auVar20._8_8_ = pos[1].type_ast;
      auVar20._0_8_ = pos[lVar5 * -2 + 2].type_ast;
    }
    switch(iVar4) {
    case 2:
      root.type_ast = allocast(-10000,"Program",(YYLTYPE *)pos,1,pYVar15->type_ast);
      ast_root = root.type_ast;
      if (error_state == 0) {
        printast(root.type_ast);
      }
      else {
        reportpreyyerror();
      }
      goto LAB_00102f07;
    case 3:
      pYVar7 = pos + -2;
      paVar11 = pYVar15[-1].type_ast;
      paVar12 = pYVar15->type_ast;
      pcVar10 = "ExtDefList";
      iVar17 = 2;
      nodetype = -9999;
      break;
    case 4:
    case 0x14:
    case 0x22:
    case 0x2d:
      root.type_ast = allocast(-1,"NullNode",&yylloc,0);
      goto LAB_00102f07;
    case 5:
    case 7:
      pYVar7 = pos + -4;
      paVar11 = pYVar15[-2].type_ast;
      paVar12 = pYVar15[-1].type_ast;
      iVar17 = 3;
      goto LAB_00102d28;
    case 6:
      pYVar7 = pos + -2;
      paVar11 = pYVar15[-1].type_ast;
      paVar12 = pYVar15->type_ast;
      iVar17 = 2;
LAB_00102d28:
      pcVar10 = "ExtDef";
      nodetype = -0x270e;
      break;
    case 8:
    case 10:
    case 0xb:
    case 0x1b:
    case 0x29:
    case 0x30:
      pYVar7 = pos + -6;
      goto LAB_00102cdf;
    case 9:
      pYVar7 = pos + -4;
      goto LAB_00102cdf;
    case 0xc:
    case 0x2b:
      pYVar7 = pos + -2;
LAB_00102cdf:
      root.type_ast = allocast(-2,"ErrorNode",(YYLTYPE *)pYVar7,0);
      pcVar10 = "Syntax error, before \'%s\'";
LAB_00102d06:
      syntaxerror(pcVar10,yytext);
      goto LAB_00102f07;
    case 0xd:
      paVar11 = pYVar15->type_ast;
      pcVar10 = "ExtDecList";
      iVar17 = -0x270d;
      goto LAB_00102ea7;
    case 0xe:
      pYVar7 = pos + -4;
      paVar11 = pYVar15[-2].type_ast;
      paVar12 = pYVar15[-1].type_ast;
      pcVar10 = "ExtDecList";
      iVar17 = 3;
      nodetype = -0x270d;
      break;
    case 0xf:
    case 0x10:
      paVar11 = pYVar15->type_ast;
      pcVar10 = "Specifier";
      iVar17 = -0x270c;
      goto LAB_00102ea7;
    case 0x11:
      pYVar7 = pos + -8;
      paVar11 = pYVar15[-4].type_ast;
      paVar12 = pYVar15[-3].type_ast;
      iVar17 = 5;
      goto LAB_00102e6e;
    case 0x12:
      pYVar7 = pos + -2;
      paVar11 = pYVar15[-1].type_ast;
      paVar12 = pYVar15->type_ast;
      iVar17 = 2;
LAB_00102e6e:
      pcVar10 = "StructSpecifier";
      nodetype = -0x270b;
      break;
    case 0x13:
      paVar11 = pYVar15->type_ast;
      pcVar10 = "OptTag";
      iVar17 = -0x270a;
      goto LAB_00102ea7;
    case 0x15:
      paVar11 = pYVar15->type_ast;
      pcVar10 = "Tag";
      iVar17 = -0x2709;
      goto LAB_00102ea7;
    case 0x16:
      paVar11 = pYVar15->type_ast;
      pcVar10 = "VarDec";
      iVar17 = -0x2708;
      goto LAB_00102ea7;
    case 0x17:
      pYVar7 = pos + -6;
      paVar11 = pYVar15[-3].type_ast;
      paVar12 = pYVar15[-2].type_ast;
      pcVar10 = "VarDec";
      iVar17 = 4;
      nodetype = -0x2708;
      break;
    case 0x18:
    case 0x2a:
    case 0x2f:
      pYVar7 = pos + -6;
      goto LAB_00102a67;
    case 0x19:
      pYVar7 = pos + -6;
      paVar11 = pYVar15[-3].type_ast;
      paVar12 = pYVar15[-2].type_ast;
      iVar17 = 4;
      goto LAB_00102db3;
    case 0x1a:
      pYVar7 = pos + -4;
      paVar11 = pYVar15[-2].type_ast;
      paVar12 = pYVar15[-1].type_ast;
      iVar17 = 3;
LAB_00102db3:
      pcVar10 = "FunDec";
      nodetype = -0x2707;
      break;
    case 0x1c:
      pYVar7 = pos + -4;
      paVar11 = pYVar15[-2].type_ast;
      paVar12 = pYVar15[-1].type_ast;
      pcVar10 = "VarList";
      iVar17 = 3;
      nodetype = -0x2706;
      break;
    case 0x1d:
      paVar11 = pYVar15->type_ast;
      pcVar10 = "VarList";
      iVar17 = -0x2706;
      goto LAB_00102ea7;
    case 0x1e:
      pYVar7 = pos + -2;
      paVar11 = pYVar15[-1].type_ast;
      paVar12 = pYVar15->type_ast;
      pcVar10 = "ParamDec";
      iVar17 = 2;
      nodetype = -0x2705;
      break;
    case 0x1f:
      pYVar7 = pos + -6;
      paVar11 = pYVar15[-3].type_ast;
      paVar12 = pYVar15[-2].type_ast;
      pcVar10 = "CompSt";
      iVar17 = 4;
      nodetype = -0x2704;
      break;
    case 0x20:
      pYVar7 = pos + -8;
LAB_00102a67:
      root.type_ast = allocast(-2,"ErrorNode",(YYLTYPE *)pYVar7,0);
      pcVar10 = "Syntax error, near \'%s\'";
      goto LAB_00102d06;
    case 0x21:
      pYVar7 = pos + -2;
      paVar11 = pYVar15[-1].type_ast;
      paVar12 = pYVar15->type_ast;
      pcVar10 = "StmtList";
      iVar17 = 2;
      nodetype = -0x2703;
      break;
    case 0x23:
      pYVar7 = pos + -2;
      paVar11 = pYVar15[-1].type_ast;
      paVar12 = pYVar15->type_ast;
      iVar17 = 2;
      goto LAB_00102e23;
    case 0x24:
      paVar11 = pYVar15->type_ast;
      pcVar10 = "Stmt";
      iVar17 = -0x2702;
      goto LAB_00102ea7;
    case 0x25:
      pYVar7 = pos + -4;
      paVar11 = pYVar15[-2].type_ast;
      paVar12 = pYVar15[-1].type_ast;
      iVar17 = 3;
      goto LAB_00102e23;
    case 0x26:
    case 0x28:
      pYVar7 = pos + -8;
      paVar11 = pYVar15[-4].type_ast;
      paVar12 = pYVar15[-3].type_ast;
      iVar17 = 5;
      goto LAB_00102e23;
    case 0x27:
      pYVar7 = pos + -0xc;
      paVar11 = pYVar15[-6].type_ast;
      paVar12 = pYVar15[-5].type_ast;
      iVar17 = 7;
LAB_00102e23:
      pcVar10 = "Stmt";
      nodetype = -0x2702;
      break;
    case 0x2c:
      pYVar7 = pos + -2;
      paVar11 = pYVar15[-1].type_ast;
      paVar12 = pYVar15->type_ast;
      pcVar10 = "DefList";
      iVar17 = 2;
      nodetype = -0x2701;
      break;
    case 0x2e:
      pYVar7 = pos + -4;
      paVar11 = pYVar15[-2].type_ast;
      paVar12 = pYVar15[-1].type_ast;
      pcVar10 = "Def";
      iVar17 = 3;
      nodetype = -0x2700;
      break;
    case 0x31:
      paVar11 = pYVar15->type_ast;
      pcVar10 = "DecList";
      iVar17 = -0x26fe;
      goto LAB_00102ea7;
    case 0x32:
      pYVar7 = pos + -4;
      paVar11 = pYVar15[-2].type_ast;
      paVar12 = pYVar15[-1].type_ast;
      pcVar10 = "DecList";
      iVar17 = 3;
      nodetype = -0x26fe;
      break;
    case 0x33:
      paVar11 = pYVar15->type_ast;
      pcVar10 = "Dec";
      iVar17 = -0x26ff;
      goto LAB_00102ea7;
    case 0x34:
      pYVar7 = pos + -4;
      paVar11 = pYVar15[-2].type_ast;
      paVar12 = pYVar15[-1].type_ast;
      pcVar10 = "Dec";
      iVar17 = 3;
      nodetype = -0x26ff;
      break;
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
    case 0x3a:
    case 0x3b:
    case 0x3c:
    case 0x3d:
    case 0x41:
    case 0x43:
      pYVar7 = pos + -4;
      paVar11 = pYVar15[-2].type_ast;
      paVar12 = pYVar15[-1].type_ast;
      iVar17 = 3;
      goto LAB_00102828;
    case 0x3e:
    case 0x3f:
      pYVar7 = pos + -2;
      paVar11 = pYVar15[-1].type_ast;
      paVar12 = pYVar15->type_ast;
      iVar17 = 2;
      goto LAB_00102828;
    case 0x40:
    case 0x42:
      pYVar7 = pos + -6;
      paVar11 = pYVar15[-3].type_ast;
      paVar12 = pYVar15[-2].type_ast;
      iVar17 = 4;
LAB_00102828:
      pcVar10 = "Exp";
      nodetype = -0x26fd;
      break;
    case 0x44:
    case 0x45:
    case 0x46:
      paVar11 = pYVar15->type_ast;
      pcVar10 = "Exp";
      iVar17 = -0x26fd;
      goto LAB_00102ea7;
    case 0x47:
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x4b:
    case 0x4c:
    case 0x4d:
    case 0x4e:
    case 0x4f:
    case 0x50:
      pYVar7 = pos + -4;
      goto LAB_001028ef;
    case 0x51:
      pYVar7 = pos + -2;
LAB_001028ef:
      root.type_ast = allocast(-2,"ErrorNode",(YYLTYPE *)pYVar7,0);
      pcVar10 = "Syntax error, near %s";
      goto LAB_00102d06;
    case 0x52:
      pYVar7 = pos + -4;
      paVar11 = pYVar15[-2].type_ast;
      paVar12 = pYVar15[-1].type_ast;
      pcVar10 = "Args";
      iVar17 = 3;
      nodetype = -0x26fc;
      break;
    case 0x53:
      paVar11 = pYVar15->type_ast;
      pcVar10 = "Args";
      iVar17 = -0x26fc;
LAB_00102ea7:
      root.type_ast = allocast(iVar17,pcVar10,(YYLTYPE *)pos,1,paVar11);
      goto LAB_00102f07;
    default:
      root = pYVar15[1 - lVar5];
      goto LAB_00102f07;
    }
    root.type_ast = allocast(nodetype,pcVar10,(YYLTYPE *)pYVar7,iVar17,paVar11,paVar12);
LAB_00102f07:
    pbVar14 = pbVar14 + -lVar5;
    pYVar15[1 - lVar5] = root;
    pYVar15 = pYVar15 + (1 - lVar5);
    *(undefined1 (*) [16])(pos + lVar5 * -2 + 2) = auVar20;
    pos = pos + lVar5 * -2 + 2;
    uVar9 = (int)*(short *)("" + (long)""[iVar4] * 2 + 0x22) + (uint)*pbVar14;
    if ((uVar9 < 0x188) && ((int)yycheck[uVar9] == (uint)*pbVar14)) {
      iVar17 = (int)yytable[uVar9];
    }
    else {
      iVar17 = (int)*(char *)((long)yypgoto + (long)""[iVar4] + 0x11);
    }
LAB_00102f79:
    pbVar14 = pbVar14 + 1;
  } while( true );
}

Assistant:

int
yyparse (void)
{
    yy_state_fast_t yystate = 0;
    /* Number of tokens to shift before error messages enabled.  */
    int yyerrstatus = 0;

    /* Refer to the stacks through separate pointers, to allow yyoverflow
       to reallocate them elsewhere.  */

    /* Their size.  */
    YYPTRDIFF_T yystacksize = YYINITDEPTH;

    /* The state stack: array, bottom, top.  */
    yy_state_t yyssa[YYINITDEPTH];
    yy_state_t *yyss = yyssa;
    yy_state_t *yyssp = yyss;

    /* The semantic value stack: array, bottom, top.  */
    YYSTYPE yyvsa[YYINITDEPTH];
    YYSTYPE *yyvs = yyvsa;
    YYSTYPE *yyvsp = yyvs;

    /* The location stack: array, bottom, top.  */
    YYLTYPE yylsa[YYINITDEPTH];
    YYLTYPE *yyls = yylsa;
    YYLTYPE *yylsp = yyls;

  int yyn;
  /* The return value of yyparse.  */
  int yyresult;
  /* Lookahead symbol kind.  */
  yysymbol_kind_t yytoken = YYSYMBOL_YYEMPTY;
  /* The variables used to return semantic value and location from the
     action routines.  */
  YYSTYPE yyval;
  YYLTYPE yyloc;

  /* The locations where the error started and ended.  */
  YYLTYPE yyerror_range[3];



#define YYPOPSTACK(N)   (yyvsp -= (N), yyssp -= (N), yylsp -= (N))

  /* The number of symbols on the RHS of the reduced rule.
     Keep to zero when no symbol should be popped.  */
  int yylen = 0;

  YYDPRINTF ((stderr, "Starting parse\n"));

  yychar = YYEMPTY; /* Cause a token to be read.  */

  yylsp[0] = yylloc;
  goto yysetstate;


/*------------------------------------------------------------.
| yynewstate -- push a new state, which is found in yystate.  |
`------------------------------------------------------------*/
yynewstate:
  /* In all cases, when you get here, the value and location stacks
     have just been pushed.  So pushing a state here evens the stacks.  */
  yyssp++;


/*--------------------------------------------------------------------.
| yysetstate -- set current state (the top of the stack) to yystate.  |
`--------------------------------------------------------------------*/
yysetstate:
  YYDPRINTF ((stderr, "Entering state %d\n", yystate));
  YY_ASSERT (0 <= yystate && yystate < YYNSTATES);
  YY_IGNORE_USELESS_CAST_BEGIN
  *yyssp = YY_CAST (yy_state_t, yystate);
  YY_IGNORE_USELESS_CAST_END
  YY_STACK_PRINT (yyss, yyssp);

  if (yyss + yystacksize - 1 <= yyssp)
#if !defined yyoverflow && !defined YYSTACK_RELOCATE
    YYNOMEM;
#else
    {
      /* Get the current used size of the three stacks, in elements.  */
      YYPTRDIFF_T yysize = yyssp - yyss + 1;

# if defined yyoverflow
      {
        /* Give user a chance to reallocate the stack.  Use copies of
           these so that the &'s don't force the real ones into
           memory.  */
        yy_state_t *yyss1 = yyss;
        YYSTYPE *yyvs1 = yyvs;
        YYLTYPE *yyls1 = yyls;

        /* Each stack pointer address is followed by the size of the
           data in use in that stack, in bytes.  This used to be a
           conditional around just the two extra args, but that might
           be undefined if yyoverflow is a macro.  */
        yyoverflow (YY_("memory exhausted"),
                    &yyss1, yysize * YYSIZEOF (*yyssp),
                    &yyvs1, yysize * YYSIZEOF (*yyvsp),
                    &yyls1, yysize * YYSIZEOF (*yylsp),
                    &yystacksize);
        yyss = yyss1;
        yyvs = yyvs1;
        yyls = yyls1;
      }
# else /* defined YYSTACK_RELOCATE */
      /* Extend the stack our own way.  */
      if (YYMAXDEPTH <= yystacksize)
        YYNOMEM;
      yystacksize *= 2;
      if (YYMAXDEPTH < yystacksize)
        yystacksize = YYMAXDEPTH;

      {
        yy_state_t *yyss1 = yyss;
        union yyalloc *yyptr =
          YY_CAST (union yyalloc *,
                   YYSTACK_ALLOC (YY_CAST (YYSIZE_T, YYSTACK_BYTES (yystacksize))));
        if (! yyptr)
          YYNOMEM;
        YYSTACK_RELOCATE (yyss_alloc, yyss);
        YYSTACK_RELOCATE (yyvs_alloc, yyvs);
        YYSTACK_RELOCATE (yyls_alloc, yyls);
#  undef YYSTACK_RELOCATE
        if (yyss1 != yyssa)
          YYSTACK_FREE (yyss1);
      }
# endif

      yyssp = yyss + yysize - 1;
      yyvsp = yyvs + yysize - 1;
      yylsp = yyls + yysize - 1;

      YY_IGNORE_USELESS_CAST_BEGIN
      YYDPRINTF ((stderr, "Stack size increased to %ld\n",
                  YY_CAST (long, yystacksize)));
      YY_IGNORE_USELESS_CAST_END

      if (yyss + yystacksize - 1 <= yyssp)
        YYABORT;
    }
#endif /* !defined yyoverflow && !defined YYSTACK_RELOCATE */


  if (yystate == YYFINAL)
    YYACCEPT;

  goto yybackup;


/*-----------.
| yybackup.  |
`-----------*/
yybackup:
  /* Do appropriate processing given the current state.  Read a
     lookahead token if we need one and don't already have one.  */

  /* First try to decide what to do without reference to lookahead token.  */
  yyn = yypact[yystate];
  if (yypact_value_is_default (yyn))
    goto yydefault;

  /* Not known => get a lookahead token if don't already have one.  */

  /* YYCHAR is either empty, or end-of-input, or a valid lookahead.  */
  if (yychar == YYEMPTY)
    {
      YYDPRINTF ((stderr, "Reading a token\n"));
      yychar = yylex ();
    }

  if (yychar <= YYEOF)
    {
      yychar = YYEOF;
      yytoken = YYSYMBOL_YYEOF;
      YYDPRINTF ((stderr, "Now at end of input.\n"));
    }
  else if (yychar == YYerror)
    {
      /* The scanner already issued an error message, process directly
         to error recovery.  But do not keep the error token as
         lookahead, it is too special and may lead us to an endless
         loop in error recovery. */
      yychar = YYUNDEF;
      yytoken = YYSYMBOL_YYerror;
      yyerror_range[1] = yylloc;
      goto yyerrlab1;
    }
  else
    {
      yytoken = YYTRANSLATE (yychar);
      YY_SYMBOL_PRINT ("Next token is", yytoken, &yylval, &yylloc);
    }

  /* If the proper action on seeing token YYTOKEN is to reduce or to
     detect an error, take that action.  */
  yyn += yytoken;
  if (yyn < 0 || YYLAST < yyn || yycheck[yyn] != yytoken)
    goto yydefault;
  yyn = yytable[yyn];
  if (yyn <= 0)
    {
      if (yytable_value_is_error (yyn))
        goto yyerrlab;
      yyn = -yyn;
      goto yyreduce;
    }

  /* Count tokens shifted since error; after three, turn off error
     status.  */
  if (yyerrstatus)
    yyerrstatus--;

  /* Shift the lookahead token.  */
  YY_SYMBOL_PRINT ("Shifting", yytoken, &yylval, &yylloc);
  yystate = yyn;
  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END
  *++yylsp = yylloc;

  /* Discard the shifted token.  */
  yychar = YYEMPTY;
  goto yynewstate;


/*-----------------------------------------------------------.
| yydefault -- do the default action for the current state.  |
`-----------------------------------------------------------*/
yydefault:
  yyn = yydefact[yystate];
  if (yyn == 0)
    goto yyerrlab;
  goto yyreduce;


/*-----------------------------.
| yyreduce -- do a reduction.  |
`-----------------------------*/
yyreduce:
  /* yyn is the number of a rule to reduce with.  */
  yylen = yyr2[yyn];

  /* If YYLEN is nonzero, implement the default value of the action:
     '$$ = $1'.

     Otherwise, the following line sets YYVAL to garbage.
     This behavior is undocumented and Bison
     users should not rely upon it.  Assigning to YYVAL
     unconditionally makes the parser a bit smaller, and it avoids a
     GCC warning that YYVAL may be used uninitialized.  */
  yyval = yyvsp[1-yylen];

  /* Default location. */
  YYLLOC_DEFAULT (yyloc, (yylsp - yylen), yylen);
  yyerror_range[1] = yyloc;
  YY_REDUCE_PRINT (yyn);
  switch (yyn)
    {
  case 2: /* Program: ExtDefList  */
#line 35 "parser/parser.y"
                    { (yyval.type_ast) = ALLOCAST(Program, &(yylsp[0]), 1, (yyvsp[0].type_ast)); ast_root = (yyval.type_ast); if (!error_state) printast((yyval.type_ast)); else reportpreyyerror(); }
#line 1375 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 3: /* ExtDefList: ExtDef ExtDefList  */
#line 37 "parser/parser.y"
                              { (yyval.type_ast) = ALLOCAST(ExtDefList, &(yylsp[-1]), 2, (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1381 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 4: /* ExtDefList: %empty  */
#line 38 "parser/parser.y"
                 { (yyval.type_ast) = ALLOCNODE(NullNode);}
#line 1387 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 5: /* ExtDef: Specifier ExtDecList SEMI  */
#line 40 "parser/parser.y"
                                  { (yyval.type_ast) = ALLOCAST(ExtDef, &(yylsp[-2]), 3, (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1393 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 6: /* ExtDef: Specifier SEMI  */
#line 41 "parser/parser.y"
                         { (yyval.type_ast) = ALLOCAST(ExtDef, &(yylsp[-1]), 2, (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1399 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 7: /* ExtDef: Specifier FunDec CompSt  */
#line 42 "parser/parser.y"
                                  { (yyval.type_ast) = ALLOCAST(ExtDef, &(yylsp[-2]), 3, (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1405 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 8: /* ExtDef: Specifier ExtDecList error SEMI  */
#line 43 "parser/parser.y"
                                          { (yyval.type_ast) = ALLOCERRNODE(ErrorNode, &(yylsp[-3])); syntaxerror("Syntax error, before '%s'", yytext); }
#line 1411 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 9: /* ExtDef: Specifier error SEMI  */
#line 44 "parser/parser.y"
                               { (yyval.type_ast) = ALLOCERRNODE(ErrorNode, &(yylsp[-2])); syntaxerror("Syntax error, before '%s'", yytext); }
#line 1417 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 10: /* ExtDef: Specifier error FunDec CompSt  */
#line 45 "parser/parser.y"
                                        { (yyval.type_ast) = ALLOCERRNODE(ErrorNode, &(yylsp[-3])); syntaxerror("Syntax error, before '%s'", yytext); }
#line 1423 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 11: /* ExtDef: Specifier FunDec error CompSt  */
#line 46 "parser/parser.y"
                                        { (yyval.type_ast) = ALLOCERRNODE(ErrorNode, &(yylsp[-3])); syntaxerror("Syntax error, before '%s'", yytext); }
#line 1429 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 12: /* ExtDef: Specifier error  */
#line 47 "parser/parser.y"
                          { (yyval.type_ast) = ALLOCERRNODE(ErrorNode, &(yylsp[-1])); syntaxerror("Syntax error, before '%s'", yytext); }
#line 1435 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 13: /* ExtDecList: VarDec  */
#line 49 "parser/parser.y"
                   { (yyval.type_ast) = ALLOCAST(ExtDecList, &(yylsp[0]), 1, (yyvsp[0].type_ast)); }
#line 1441 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 14: /* ExtDecList: VarDec COMMA ExtDecList  */
#line 50 "parser/parser.y"
                                  { (yyval.type_ast) = ALLOCAST(ExtDecList, &(yylsp[-2]), 3, (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1447 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 15: /* Specifier: TYPE  */
#line 54 "parser/parser.y"
                { (yyval.type_ast) = ALLOCAST(Specifier, &(yylsp[0]), 1,  (yyvsp[0].type_ast)); }
#line 1453 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 16: /* Specifier: StructSpecifier  */
#line 55 "parser/parser.y"
                          { (yyval.type_ast) = ALLOCAST(Specifier, &(yylsp[0]), 1, (yyvsp[0].type_ast)); }
#line 1459 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 17: /* StructSpecifier: STRUCT OptTag LC DefList RC  */
#line 57 "parser/parser.y"
                                             { (yyval.type_ast) = ALLOCAST(StructSpecifier, &(yylsp[-4]), 5, (yyvsp[-4].type_ast), (yyvsp[-3].type_ast), (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1465 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 18: /* StructSpecifier: STRUCT Tag  */
#line 58 "parser/parser.y"
                     { (yyval.type_ast) = ALLOCAST(StructSpecifier, &(yylsp[-1]), 2, (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1471 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 19: /* OptTag: ID  */
#line 60 "parser/parser.y"
           { (yyval.type_ast) = ALLOCAST(OptTag, &(yylsp[0]), 1, (yyvsp[0].type_ast)); }
#line 1477 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 20: /* OptTag: %empty  */
#line 61 "parser/parser.y"
                 { (yyval.type_ast) = ALLOCNODE(NullNode); }
#line 1483 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 21: /* Tag: ID  */
#line 63 "parser/parser.y"
        { (yyval.type_ast) = ALLOCAST(Tag, &(yylsp[0]), 1, (yyvsp[0].type_ast)); }
#line 1489 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 22: /* VarDec: ID  */
#line 67 "parser/parser.y"
           { (yyval.type_ast) = ALLOCAST(VarDec, &(yylsp[0]), 1, (yyvsp[0].type_ast)); }
#line 1495 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 23: /* VarDec: VarDec LB INT RB  */
#line 68 "parser/parser.y"
                           { (yyval.type_ast) = ALLOCAST(VarDec, &(yylsp[-3]), 4, (yyvsp[-3].type_ast), (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1501 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 24: /* VarDec: VarDec LB error RB  */
#line 69 "parser/parser.y"
                             { (yyval.type_ast) = ALLOCERRNODE(ErrorNode, &(yylsp[-3])); syntaxerror("Syntax error, near '%s'", yytext); }
#line 1507 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 25: /* FunDec: ID LP VarList RP  */
#line 71 "parser/parser.y"
                         { (yyval.type_ast) = ALLOCAST(FunDec, &(yylsp[-3]), 4, (yyvsp[-3].type_ast), (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1513 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 26: /* FunDec: ID LP RP  */
#line 72 "parser/parser.y"
                   { (yyval.type_ast) = ALLOCAST(FunDec, &(yylsp[-2]), 3, (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1519 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 27: /* FunDec: ID LP error RP  */
#line 73 "parser/parser.y"
                         { (yyval.type_ast) = ALLOCERRNODE(ErrorNode, &(yylsp[-3])); syntaxerror("Syntax error, before '%s'", yytext); }
#line 1525 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 28: /* VarList: ParamDec COMMA VarList  */
#line 75 "parser/parser.y"
                                { (yyval.type_ast) = ALLOCAST(VarList, &(yylsp[-2]), 3, (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1531 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 29: /* VarList: ParamDec  */
#line 76 "parser/parser.y"
                   { (yyval.type_ast) = ALLOCAST(VarList, &(yylsp[0]), 1, (yyvsp[0].type_ast)); }
#line 1537 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 30: /* ParamDec: Specifier VarDec  */
#line 78 "parser/parser.y"
                           { (yyval.type_ast) = ALLOCAST(ParamDec, &(yylsp[-1]), 2, (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1543 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 31: /* CompSt: LC DefList StmtList RC  */
#line 82 "parser/parser.y"
                               { (yyval.type_ast) = ALLOCAST(CompSt, &(yylsp[-3]), 4, (yyvsp[-3].type_ast), (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1549 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 32: /* CompSt: LC error DefList StmtList RC  */
#line 83 "parser/parser.y"
                                       { (yyval.type_ast) = ALLOCERRNODE(ErrorNode, &(yylsp[-4])); syntaxerror("Syntax error, near '%s'", yytext); }
#line 1555 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 33: /* StmtList: Stmt StmtList  */
#line 85 "parser/parser.y"
                        { (yyval.type_ast) = ALLOCAST(StmtList, &(yylsp[-1]), 2, (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1561 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 34: /* StmtList: %empty  */
#line 86 "parser/parser.y"
                 { (yyval.type_ast) = ALLOCNODE(NullNode); }
#line 1567 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 35: /* Stmt: Exp SEMI  */
#line 88 "parser/parser.y"
               { (yyval.type_ast) = ALLOCAST(Stmt, &(yylsp[-1]), 2, (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1573 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 36: /* Stmt: CompSt  */
#line 89 "parser/parser.y"
                 { (yyval.type_ast) = ALLOCAST(Stmt, &(yylsp[0]), 1, (yyvsp[0].type_ast)); }
#line 1579 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 37: /* Stmt: RETURN Exp SEMI  */
#line 90 "parser/parser.y"
                          { (yyval.type_ast) = ALLOCAST(Stmt, &(yylsp[-2]), 3, (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1585 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 38: /* Stmt: IF LP Exp RP Stmt  */
#line 91 "parser/parser.y"
                                                  { (yyval.type_ast) = ALLOCAST(Stmt, &(yylsp[-4]), 5, (yyvsp[-4].type_ast), (yyvsp[-3].type_ast), (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1591 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 39: /* Stmt: IF LP Exp RP Stmt ELSE Stmt  */
#line 92 "parser/parser.y"
                                      { (yyval.type_ast) = ALLOCAST(Stmt, &(yylsp[-6]), 7, (yyvsp[-6].type_ast), (yyvsp[-5].type_ast), (yyvsp[-4].type_ast), (yyvsp[-3].type_ast), (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1597 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 40: /* Stmt: WHILE LP Exp RP Stmt  */
#line 93 "parser/parser.y"
                               { (yyval.type_ast) = ALLOCAST(Stmt, &(yylsp[-4]), 5, (yyvsp[-4].type_ast), (yyvsp[-3].type_ast), (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1603 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 41: /* Stmt: RETURN Exp error SEMI  */
#line 94 "parser/parser.y"
                                { (yyval.type_ast) = ALLOCERRNODE(ErrorNode, &(yylsp[-3])); syntaxerror("Syntax error, before '%s'", yytext); }
#line 1609 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 42: /* Stmt: RETURN error Exp SEMI  */
#line 95 "parser/parser.y"
                                { (yyval.type_ast) = ALLOCERRNODE(ErrorNode, &(yylsp[-3])); syntaxerror("Syntax error, near '%s'", yytext); }
#line 1615 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 43: /* Stmt: Exp error  */
#line 96 "parser/parser.y"
                    { (yyval.type_ast) = ALLOCERRNODE(ErrorNode, &(yylsp[-1])); syntaxerror("Syntax error, before '%s'", yytext); }
#line 1621 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 44: /* DefList: Def DefList  */
#line 100 "parser/parser.y"
                     { (yyval.type_ast) = ALLOCAST(DefList, &(yylsp[-1]), 2, (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1627 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 45: /* DefList: %empty  */
#line 101 "parser/parser.y"
                 { (yyval.type_ast) = ALLOCNODE(NullNode); }
#line 1633 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 46: /* Def: Specifier DecList SEMI  */
#line 103 "parser/parser.y"
                            { (yyval.type_ast) = ALLOCAST(Def, &(yylsp[-2]), 3, (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1639 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 47: /* Def: Specifier error DecList SEMI  */
#line 104 "parser/parser.y"
                                       { (yyval.type_ast) = ALLOCERRNODE(ErrorNode, &(yylsp[-3])); syntaxerror("Syntax error, near '%s'", yytext); }
#line 1645 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 48: /* Def: Specifier DecList error SEMI  */
#line 105 "parser/parser.y"
                                       { (yyval.type_ast) = ALLOCERRNODE(ErrorNode, &(yylsp[-3])); syntaxerror("Syntax error, before '%s'", yytext); }
#line 1651 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 49: /* DecList: Dec  */
#line 107 "parser/parser.y"
             { (yyval.type_ast) = ALLOCAST(DecList, &(yylsp[0]), 1, (yyvsp[0].type_ast)); }
#line 1657 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 50: /* DecList: Dec COMMA DecList  */
#line 108 "parser/parser.y"
                            { (yyval.type_ast) = ALLOCAST(DecList, &(yylsp[-2]), 3, (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1663 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 51: /* Dec: VarDec  */
#line 110 "parser/parser.y"
            { (yyval.type_ast) = ALLOCAST(Dec, &(yylsp[0]), 1, (yyvsp[0].type_ast)); }
#line 1669 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 52: /* Dec: VarDec ASSIGNOP Exp  */
#line 111 "parser/parser.y"
                              { (yyval.type_ast) = ALLOCAST(Dec, &(yylsp[-2]), 3, (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1675 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 53: /* Exp: Exp ASSIGNOP Exp  */
#line 115 "parser/parser.y"
                      { (yyval.type_ast) = ALLOCAST(Exp, &(yylsp[-2]), 3, (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1681 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 54: /* Exp: Exp AND Exp  */
#line 116 "parser/parser.y"
                      { (yyval.type_ast) = ALLOCAST(Exp, &(yylsp[-2]), 3, (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1687 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 55: /* Exp: Exp OR Exp  */
#line 117 "parser/parser.y"
                     { (yyval.type_ast) = ALLOCAST(Exp, &(yylsp[-2]), 3, (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1693 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 56: /* Exp: Exp RELOP Exp  */
#line 118 "parser/parser.y"
                        { (yyval.type_ast) = ALLOCAST(Exp, &(yylsp[-2]), 3, (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1699 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 57: /* Exp: Exp PLUS Exp  */
#line 119 "parser/parser.y"
                       { (yyval.type_ast) = ALLOCAST(Exp, &(yylsp[-2]), 3, (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1705 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 58: /* Exp: Exp MINUS Exp  */
#line 120 "parser/parser.y"
                        { (yyval.type_ast) = ALLOCAST(Exp, &(yylsp[-2]), 3, (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1711 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 59: /* Exp: Exp STAR Exp  */
#line 121 "parser/parser.y"
                       { (yyval.type_ast) = ALLOCAST(Exp, &(yylsp[-2]), 3, (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1717 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 60: /* Exp: Exp DIV Exp  */
#line 122 "parser/parser.y"
                      { (yyval.type_ast) = ALLOCAST(Exp, &(yylsp[-2]), 3, (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1723 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 61: /* Exp: LP Exp RP  */
#line 123 "parser/parser.y"
                    { (yyval.type_ast) = ALLOCAST(Exp, &(yylsp[-2]), 3, (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1729 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 62: /* Exp: MINUS Exp  */
#line 124 "parser/parser.y"
                    { (yyval.type_ast) = ALLOCAST(Exp, &(yylsp[-1]), 2, (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1735 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 63: /* Exp: NOT Exp  */
#line 125 "parser/parser.y"
                  { (yyval.type_ast) = ALLOCAST(Exp, &(yylsp[-1]), 2, (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1741 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 64: /* Exp: ID LP Args RP  */
#line 126 "parser/parser.y"
                        { (yyval.type_ast) = ALLOCAST(Exp, &(yylsp[-3]), 4, (yyvsp[-3].type_ast), (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1747 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 65: /* Exp: ID LP RP  */
#line 127 "parser/parser.y"
                   { (yyval.type_ast) = ALLOCAST(Exp, &(yylsp[-2]), 3, (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1753 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 66: /* Exp: Exp LB Exp RB  */
#line 128 "parser/parser.y"
                        { (yyval.type_ast) = ALLOCAST(Exp, &(yylsp[-3]), 4, (yyvsp[-3].type_ast), (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1759 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 67: /* Exp: Exp DOT ID  */
#line 129 "parser/parser.y"
                     { (yyval.type_ast) = ALLOCAST(Exp, &(yylsp[-2]), 3, (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1765 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 68: /* Exp: ID  */
#line 130 "parser/parser.y"
             { (yyval.type_ast) = ALLOCAST(Exp, &(yylsp[0]), 1, (yyvsp[0].type_ast)); }
#line 1771 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 69: /* Exp: INT  */
#line 131 "parser/parser.y"
              { (yyval.type_ast) = ALLOCAST(Exp, &(yylsp[0]), 1, (yyvsp[0].type_ast)); }
#line 1777 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 70: /* Exp: FLOAT  */
#line 132 "parser/parser.y"
                { (yyval.type_ast) = ALLOCAST(Exp, &(yylsp[0]), 1, (yyvsp[0].type_ast)); }
#line 1783 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 71: /* Exp: Exp LB error  */
#line 133 "parser/parser.y"
                       { (yyval.type_ast) = ALLOCERRNODE(ErrorNode, &(yylsp[-2])); syntaxerror("Syntax error, near %s", yytext); }
#line 1789 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 72: /* Exp: Exp ASSIGNOP error  */
#line 134 "parser/parser.y"
                             { (yyval.type_ast) = ALLOCERRNODE(ErrorNode, &(yylsp[-2])); syntaxerror("Syntax error, near %s", yytext); }
#line 1795 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 73: /* Exp: Exp AND error  */
#line 135 "parser/parser.y"
                        { (yyval.type_ast) = ALLOCERRNODE(ErrorNode, &(yylsp[-2])); syntaxerror("Syntax error, near %s", yytext); }
#line 1801 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 74: /* Exp: Exp OR error  */
#line 136 "parser/parser.y"
                       { (yyval.type_ast) = ALLOCERRNODE(ErrorNode, &(yylsp[-2])); syntaxerror("Syntax error, near %s", yytext); }
#line 1807 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 75: /* Exp: Exp RELOP error  */
#line 137 "parser/parser.y"
                          { (yyval.type_ast) = ALLOCERRNODE(ErrorNode, &(yylsp[-2])); syntaxerror("Syntax error, near %s", yytext); }
#line 1813 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 76: /* Exp: Exp PLUS error  */
#line 138 "parser/parser.y"
                         { (yyval.type_ast) = ALLOCERRNODE(ErrorNode, &(yylsp[-2])); syntaxerror("Syntax error, near %s", yytext); }
#line 1819 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 77: /* Exp: Exp MINUS error  */
#line 139 "parser/parser.y"
                          { (yyval.type_ast) = ALLOCERRNODE(ErrorNode, &(yylsp[-2])); syntaxerror("Syntax error, near %s", yytext); }
#line 1825 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 78: /* Exp: Exp STAR error  */
#line 140 "parser/parser.y"
                         { (yyval.type_ast) = ALLOCERRNODE(ErrorNode, &(yylsp[-2])); syntaxerror("Syntax error, near %s", yytext); }
#line 1831 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 79: /* Exp: Exp DIV error  */
#line 141 "parser/parser.y"
                        { (yyval.type_ast) = ALLOCERRNODE(ErrorNode, &(yylsp[-2])); syntaxerror("Syntax error, near %s", yytext); }
#line 1837 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 80: /* Exp: ID LP error  */
#line 142 "parser/parser.y"
                      { (yyval.type_ast) = ALLOCERRNODE(ErrorNode, &(yylsp[-2])); syntaxerror("Syntax error, near %s", yytext); }
#line 1843 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 81: /* Exp: LP error  */
#line 143 "parser/parser.y"
                   { (yyval.type_ast) = ALLOCERRNODE(ErrorNode, &(yylsp[-1])); syntaxerror("Syntax error, near %s", yytext); }
#line 1849 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 82: /* Args: Exp COMMA Args  */
#line 145 "parser/parser.y"
                     { (yyval.type_ast) = ALLOCAST(Args, &(yylsp[-2]), 3, (yyvsp[-2].type_ast), (yyvsp[-1].type_ast), (yyvsp[0].type_ast)); }
#line 1855 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;

  case 83: /* Args: Exp  */
#line 146 "parser/parser.y"
              { (yyval.type_ast) = ALLOCAST(Args, &(yylsp[0]), 1, (yyvsp[0].type_ast)); }
#line 1861 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"
    break;


#line 1865 "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/build_O2/parser.c"

      default: break;
    }
  /* User semantic actions sometimes alter yychar, and that requires
     that yytoken be updated with the new translation.  We take the
     approach of translating immediately before every use of yytoken.
     One alternative is translating here after every semantic action,
     but that translation would be missed if the semantic action invokes
     YYABORT, YYACCEPT, or YYERROR immediately after altering yychar or
     if it invokes YYBACKUP.  In the case of YYABORT or YYACCEPT, an
     incorrect destructor might then be invoked immediately.  In the
     case of YYERROR or YYBACKUP, subsequent parser actions might lead
     to an incorrect destructor call or verbose syntax error message
     before the lookahead is translated.  */
  YY_SYMBOL_PRINT ("-> $$ =", YY_CAST (yysymbol_kind_t, yyr1[yyn]), &yyval, &yyloc);

  YYPOPSTACK (yylen);
  yylen = 0;

  *++yyvsp = yyval;
  *++yylsp = yyloc;

  /* Now 'shift' the result of the reduction.  Determine what state
     that goes to, based on the state we popped back to and the rule
     number reduced by.  */
  {
    const int yylhs = yyr1[yyn] - YYNTOKENS;
    const int yyi = yypgoto[yylhs] + *yyssp;
    yystate = (0 <= yyi && yyi <= YYLAST && yycheck[yyi] == *yyssp
               ? yytable[yyi]
               : yydefgoto[yylhs]);
  }

  goto yynewstate;


/*--------------------------------------.
| yyerrlab -- here on detecting error.  |
`--------------------------------------*/
yyerrlab:
  /* Make sure we have latest lookahead translation.  See comments at
     user semantic actions for why this is necessary.  */
  yytoken = yychar == YYEMPTY ? YYSYMBOL_YYEMPTY : YYTRANSLATE (yychar);
  /* If not already recovering from an error, report this error.  */
  if (!yyerrstatus)
    {
      ++yynerrs;
      yyerror (YY_("syntax error"));
    }

  yyerror_range[1] = yylloc;
  if (yyerrstatus == 3)
    {
      /* If just tried and failed to reuse lookahead token after an
         error, discard it.  */

      if (yychar <= YYEOF)
        {
          /* Return failure if at end of input.  */
          if (yychar == YYEOF)
            YYABORT;
        }
      else
        {
          yydestruct ("Error: discarding",
                      yytoken, &yylval, &yylloc);
          yychar = YYEMPTY;
        }
    }

  /* Else will try to reuse lookahead token after shifting the error
     token.  */
  goto yyerrlab1;


/*---------------------------------------------------.
| yyerrorlab -- error raised explicitly by YYERROR.  |
`---------------------------------------------------*/
yyerrorlab:
  /* Pacify compilers when the user code never invokes YYERROR and the
     label yyerrorlab therefore never appears in user code.  */
  if (0)
    YYERROR;
  ++yynerrs;

  /* Do not reclaim the symbols of the rule whose action triggered
     this YYERROR.  */
  YYPOPSTACK (yylen);
  yylen = 0;
  YY_STACK_PRINT (yyss, yyssp);
  yystate = *yyssp;
  goto yyerrlab1;


/*-------------------------------------------------------------.
| yyerrlab1 -- common code for both syntax error and YYERROR.  |
`-------------------------------------------------------------*/
yyerrlab1:
  yyerrstatus = 3;      /* Each real token shifted decrements this.  */

  /* Pop stack until we find a state that shifts the error token.  */
  for (;;)
    {
      yyn = yypact[yystate];
      if (!yypact_value_is_default (yyn))
        {
          yyn += YYSYMBOL_YYerror;
          if (0 <= yyn && yyn <= YYLAST && yycheck[yyn] == YYSYMBOL_YYerror)
            {
              yyn = yytable[yyn];
              if (0 < yyn)
                break;
            }
        }

      /* Pop the current state because it cannot handle the error token.  */
      if (yyssp == yyss)
        YYABORT;

      yyerror_range[1] = *yylsp;
      yydestruct ("Error: popping",
                  YY_ACCESSING_SYMBOL (yystate), yyvsp, yylsp);
      YYPOPSTACK (1);
      yystate = *yyssp;
      YY_STACK_PRINT (yyss, yyssp);
    }

  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END

  yyerror_range[2] = yylloc;
  ++yylsp;
  YYLLOC_DEFAULT (*yylsp, yyerror_range, 2);

  /* Shift the error token.  */
  YY_SYMBOL_PRINT ("Shifting", YY_ACCESSING_SYMBOL (yyn), yyvsp, yylsp);

  yystate = yyn;
  goto yynewstate;


/*-------------------------------------.
| yyacceptlab -- YYACCEPT comes here.  |
`-------------------------------------*/
yyacceptlab:
  yyresult = 0;
  goto yyreturnlab;


/*-----------------------------------.
| yyabortlab -- YYABORT comes here.  |
`-----------------------------------*/
yyabortlab:
  yyresult = 1;
  goto yyreturnlab;


/*-----------------------------------------------------------.
| yyexhaustedlab -- YYNOMEM (memory exhaustion) comes here.  |
`-----------------------------------------------------------*/
yyexhaustedlab:
  yyerror (YY_("memory exhausted"));
  yyresult = 2;
  goto yyreturnlab;


/*----------------------------------------------------------.
| yyreturnlab -- parsing is finished, clean up and return.  |
`----------------------------------------------------------*/
yyreturnlab:
  if (yychar != YYEMPTY)
    {
      /* Make sure we have latest lookahead translation.  See comments at
         user semantic actions for why this is necessary.  */
      yytoken = YYTRANSLATE (yychar);
      yydestruct ("Cleanup: discarding lookahead",
                  yytoken, &yylval, &yylloc);
    }
  /* Do not reclaim the symbols of the rule whose action triggered
     this YYABORT or YYACCEPT.  */
  YYPOPSTACK (yylen);
  YY_STACK_PRINT (yyss, yyssp);
  while (yyssp != yyss)
    {
      yydestruct ("Cleanup: popping",
                  YY_ACCESSING_SYMBOL (+*yyssp), yyvsp, yylsp);
      YYPOPSTACK (1);
    }
#ifndef yyoverflow
  if (yyss != yyssa)
    YYSTACK_FREE (yyss);
#endif

  return yyresult;
}